

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool validate_integral_image
               (_func_void_float_ptr_integral_image_ptr *original_function,
               vector<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
               *test_functions,int width,int height,float *image,bool is_padded)

{
  bool bVar1;
  integral_image *__ptr;
  ulong uVar2;
  size_type sVar3;
  const_reference pp_Var4;
  vector<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
  *in_RSI;
  code *in_RDI;
  float *in_R8;
  byte in_R9B;
  integral_image *optimized_iimage;
  int j;
  bool all_functions_equal;
  integral_image *original_iimage;
  integral_image *in_stack_ffffffffffffffc0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar6;
  byte bVar7;
  undefined8 in_stack_ffffffffffffffd0;
  
  if ((in_R9B & 1) == 0) {
    __ptr = create_integral_img((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                                (int)in_stack_ffffffffffffffc0);
  }
  else {
    __ptr = create_padded_integral_img
                      ((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                       (int)in_stack_ffffffffffffffd0);
  }
  (*in_RDI)(in_R8,__ptr);
  uVar6 = CONCAT13(1,(int3)in_stack_ffffffffffffffcc);
  uVar5 = 0;
  while( true ) {
    uVar2 = (ulong)(int)uVar5;
    sVar3 = std::
            vector<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
            ::size(in_RSI);
    if (sVar3 <= uVar2) break;
    if ((in_R9B & 1) == 0) {
      in_stack_ffffffffffffffc0 =
           create_integral_img((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                               (int)in_stack_ffffffffffffffc0);
    }
    else {
      in_stack_ffffffffffffffc0 = create_padded_integral_img((int)((ulong)__ptr >> 0x20),(int)__ptr)
      ;
    }
    pp_Var4 = std::
              vector<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
              ::operator[](in_RSI,(long)(int)uVar5);
    (**pp_Var4)(in_R8,in_stack_ffffffffffffffc0);
    bVar1 = are_float_matrices_equal
                      ((float *)CONCAT44(uVar6,uVar5),(float *)in_stack_ffffffffffffffc0,
                       (int)(uVar2 >> 0x20),(int)uVar2);
    if (!bVar1) {
      uVar6 = uVar6 & 0xffffff;
      printf("Error: compute_integral_img() test function %d does not match original function.\n",
             (ulong)uVar5);
    }
    free(in_stack_ffffffffffffffc0->padded_data);
    free(in_stack_ffffffffffffffc0);
    uVar5 = uVar5 + 1;
  }
  free(__ptr->padded_data);
  bVar7 = (byte)(uVar6 >> 0x18);
  free(__ptr);
  return (bool)(bVar7 & 1);
}

Assistant:

bool validate_integral_image(void (*original_function)(float *, struct integral_image *),
                             const std::vector<void (*)(float *, struct integral_image *)> &test_functions, int width,
                             int height, float *image, bool is_padded) {

    // Checking if original integral image should be padded and initializing it   
    struct integral_image *original_iimage;
    if (!is_padded) {
        original_iimage = create_integral_img(width, height);
    } else {
        original_iimage = create_padded_integral_img(width, height);
    }

    // Compute original integral image
    original_function(image, original_iimage);
    
    bool all_functions_equal = true;

    // Iterating through all test functions
    for (int j = 0; j < test_functions.size(); ++j) {
        
        // Checking if optimized integral image should be padded and initializing it   
        struct integral_image *optimized_iimage;
        if (!is_padded) {
            optimized_iimage = create_integral_img(width, height);
        } else {
            optimized_iimage = create_padded_integral_img(width, height);
        }
        
        // Compute optimized integral image of optimized test function j 
        test_functions[j](image, optimized_iimage);

        if (!are_float_matrices_equal(original_iimage->padded_data, 
                                      optimized_iimage->padded_data, 
                                      original_iimage->data_width, 
                                      original_iimage->data_height)) {
            all_functions_equal = false;
            printf("Error: compute_integral_img() test function %d does not match original function.\n", j);
        }

        free(optimized_iimage->padded_data);
        free(optimized_iimage);
    }

    free(original_iimage->padded_data);
    free(original_iimage);

    return all_functions_equal;

}